

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Deserializer.cpp
# Opt level: O2

size_t __thiscall
adios2::format::BP4Deserializer::ParseMetadata
          (BP4Deserializer *this,BufferSTL *bufferSTL,Engine *engine,bool firstStep)

{
  ulong uVar1;
  _func_int **pp_Var2;
  int iVar3;
  mapped_type *pmVar4;
  iterator iVar5;
  mapped_type *pmVar6;
  istream *piVar7;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var8;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_00;
  mapped_type *pmVar9;
  undefined7 in_register_00000009;
  unsigned_long uVar10;
  char *pcVar11;
  ulong uVar12;
  vector<unsigned_long,_std::allocator<unsigned_long>_> selectedSteps;
  unsigned_long local_220;
  string selectedStepsStr;
  string item;
  string local_1d8;
  stringstream ss;
  
  if ((int)CONCAT71(in_register_00000009,firstStep) == 0) {
    uVar12 = *(ulong *)(&this->field_0x1d0 + (long)this->_vptr_BP4Deserializer[-4]);
  }
  else {
    uVar12 = 0;
  }
  _ss = 0;
  pmVar4 = std::__detail::
           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)(this->_vptr_BP4Deserializer[-3] + (long)&(this->m_Minifooter).VersionTag
                           ),(key_type *)&ss);
  uVar1 = (pmVar4->_M_h)._M_element_count;
  pp_Var2 = this->_vptr_BP4Deserializer;
  *(ulong *)(&this->field_0x1d0 + (long)pp_Var2[-4]) = uVar1;
  *(ulong *)(&this->field_0x1d8 + (long)pp_Var2[-4]) = uVar1 - 1;
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(engine->m_IO->m_Parameters)._M_t,&engine->m_Name);
  selectedSteps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  selectedSteps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  selectedSteps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((_Rb_tree_header *)iVar5._M_node !=
      &(engine->m_IO->m_Parameters)._M_t._M_impl.super__Rb_tree_header) {
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&engine->m_IO->m_Parameters,&engine->m_Name);
    std::__cxx11::string::string((string *)&selectedStepsStr,(string *)pmVar6);
    std::__cxx11::stringstream::stringstream
              ((stringstream *)&ss,(string *)&selectedStepsStr,_S_out|_S_in);
    item._M_dataplus._M_p = (pointer)&item.field_2;
    item._M_string_length = 0;
    item.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&ss,(string *)&item,',');
      if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) break;
      iVar3 = std::__cxx11::stoi(&item,(size_t *)0x0,10);
      local_220 = (unsigned_long)iVar3;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (&selectedSteps,&local_220);
    }
    std::__cxx11::string::~string((string *)&item);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    std::__cxx11::string::~string((string *)&selectedStepsStr);
  }
  uVar10 = 0;
  do {
    _ss = uVar12;
    if (uVar1 <= uVar12) {
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&selectedSteps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      return uVar10;
    }
    if (selectedSteps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        selectedSteps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
LAB_0058ce18:
      pcVar11 = "Fortran";
      if (engine->m_IO->m_ArrayOrder == RowMajor) {
        pcVar11 = "C++";
      }
      std::__cxx11::string::string((string *)&local_1d8,pcVar11,(allocator *)&selectedStepsStr);
      ParsePGIndexPerStep(this,bufferSTL,&local_1d8,0,_ss + 1);
      std::__cxx11::string::~string((string *)&local_1d8);
      ParseVariablesIndexPerStep(this,bufferSTL,engine,0,_ss + 1);
      ParseAttributesIndexPerStep(this,bufferSTL,engine,0,_ss + 1);
      selectedStepsStr._M_dataplus._M_p = (pointer)0x0;
      this_00 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)std::__detail::
                   _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)(this->_vptr_BP4Deserializer[-3] +
                                   (long)&(this->m_Minifooter).VersionTag),
                                (key_type *)&selectedStepsStr);
      item._M_dataplus._M_p = (pointer)(_ss + 1);
      pmVar9 = std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[](this_00,(key_type *)&item);
      uVar10 = (pmVar9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start[3];
    }
    else {
      _Var8 = std::
              __find_if<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                        (selectedSteps.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         selectedSteps.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish,&ss);
      if (_Var8._M_current !=
          selectedSteps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish) goto LAB_0058ce18;
    }
    uVar12 = _ss + 1;
  } while( true );
}

Assistant:

size_t BP4Deserializer::ParseMetadata(const BufferSTL &bufferSTL, core::Engine &engine,
                                      const bool firstStep)
{
    const size_t oldSteps = (firstStep ? 0 : m_MetadataSet.StepsCount);
    size_t allSteps = m_MetadataIndexTable[0].size();
    m_MetadataSet.StepsCount = allSteps;
    m_MetadataSet.CurrentStep = allSteps - 1;
    size_t lastposition = 0;
    /* parse the metadata step by step using the pointers saved in the metadata
    index table */
    auto itStepsString = engine.m_IO.m_Parameters.find(engine.m_Name);
    std::vector<size_t> selectedSteps;
    if (itStepsString != engine.m_IO.m_Parameters.end())
    {
        std::string selectedStepsStr = engine.m_IO.m_Parameters[engine.m_Name];
        std::stringstream ss(selectedStepsStr);
        std::string item;

        while (std::getline(ss, item, ','))
        {
            selectedSteps.push_back(std::stoi(item));
        }
    }
    for (size_t i = oldSteps; i < allSteps; i++)
    {
        if (selectedSteps.size() == 0 ||
            std::find(selectedSteps.begin(), selectedSteps.end(), i) != selectedSteps.end())
        {
            ParsePGIndexPerStep(bufferSTL,
                                (engine.m_IO.m_ArrayOrder == ArrayOrdering::RowMajor) ? "C++"
                                                                                      : "Fortran",
                                0, i + 1);
            ParseVariablesIndexPerStep(bufferSTL, engine, 0, i + 1);
            ParseAttributesIndexPerStep(bufferSTL, engine, 0, i + 1);
            lastposition = m_MetadataIndexTable[0][i + 1][3];
        }
    }
    return lastposition;
}